

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

void incr_le(uint8_t *v,size_t len)

{
  uint8_t uVar1;
  size_t local_20;
  size_t i;
  size_t len_local;
  uint8_t *v_local;
  
  local_20 = 0;
  do {
    uVar1 = v[local_20];
    v[local_20] = uVar1 + '\x01';
    if ((uint8_t)(uVar1 + '\x01') != '\0') {
      return;
    }
    local_20 = local_20 + 1;
  } while (local_20 != len);
  return;
}

Assistant:

static inline void incr_le(uint8_t *v, size_t len)
{
  size_t i = 0;
  while (1)
  {
    if (++v[i] != 0)
      return;
    i++;
    if (i == len)
      return;
  }
}